

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_env_info(MDB_env *env,MDB_envinfo *arg)

{
  MDB_meta *pMVar1;
  uint local_2c;
  MDB_meta *meta;
  MDB_envinfo *arg_local;
  MDB_env *env_local;
  
  if ((env == (MDB_env *)0x0) || (arg == (MDB_envinfo *)0x0)) {
    env_local._4_4_ = 0x16;
  }
  else {
    pMVar1 = mdb_env_pick_meta(env);
    arg->me_mapaddr = pMVar1->mm_address;
    arg->me_last_pgno = pMVar1->mm_last_pg;
    arg->me_last_txnid = pMVar1->mm_txnid;
    arg->me_mapsize = env->me_mapsize;
    arg->me_maxreaders = env->me_maxreaders;
    if (env->me_txns == (MDB_txninfo *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = (env->me_txns->mt1).mtb.mtb_numreaders;
    }
    arg->me_numreaders = local_2c;
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

int ESECT
mdb_env_info(MDB_env *env, MDB_envinfo *arg)
{
	MDB_meta *meta;

	if (env == NULL || arg == NULL)
		return EINVAL;

	meta = mdb_env_pick_meta(env);
	arg->me_mapaddr = meta->mm_address;
	arg->me_last_pgno = meta->mm_last_pg;
	arg->me_last_txnid = meta->mm_txnid;

	arg->me_mapsize = env->me_mapsize;
	arg->me_maxreaders = env->me_maxreaders;
	arg->me_numreaders = env->me_txns ? env->me_txns->mti_numreaders : 0;
	return MDB_SUCCESS;
}